

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O2

BinaryLocation __thiscall
wasm::Debug::LocationUpdater::getNewEnd(LocationUpdater *this,BinaryLocation oldEnd)

{
  bool bVar1;
  BinaryLocation BVar2;
  
  bVar1 = hasOldExprEnd(this,oldEnd);
  if (bVar1) {
    BVar2 = getNewExprEnd(this,oldEnd);
    return BVar2;
  }
  bVar1 = hasOldFuncEnd(this,oldEnd);
  if (bVar1) {
    BVar2 = getNewFuncEnd(this,oldEnd);
    return BVar2;
  }
  bVar1 = hasOldDelimiter(this,oldEnd);
  if (bVar1) {
    BVar2 = getNewDelimiter(this,oldEnd);
    return BVar2;
  }
  return 0;
}

Assistant:

BinaryLocation getNewEnd(BinaryLocation oldEnd) const {
    if (hasOldExprEnd(oldEnd)) {
      return getNewExprEnd(oldEnd);
    } else if (hasOldFuncEnd(oldEnd)) {
      return getNewFuncEnd(oldEnd);
    } else if (hasOldDelimiter(oldEnd)) {
      return getNewDelimiter(oldEnd);
    }
    return 0;
  }